

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O3

vrna_param_t * copy_parameters(void)

{
  void *__dest;
  vrna_param_t *pvVar1;
  vrna_md_t md;
  vrna_md_t local_7f0;
  
  if (p.id == id) {
    __dest = vrna_alloc(0x33ea8);
    pvVar1 = (vrna_param_t *)memcpy(__dest,&p,0x33ea8);
    return pvVar1;
  }
  set_model_details(&local_7f0);
  pvVar1 = get_scaled_params(&local_7f0);
  return pvVar1;
}

Assistant:

PUBLIC vrna_param_t *
copy_parameters(void)
{
  vrna_param_t *copy;

  if (p.id != id) {
    vrna_md_t md;
    set_model_details(&md);
    return vrna_params(&md);
  } else {
    copy = (vrna_param_t *)vrna_alloc(sizeof(vrna_param_t));
    memcpy(copy, &p, sizeof(vrna_param_t));
  }

  return copy;
}